

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::
MergeCapturedValues<JsUtil::KeyValuePair<StackSym*,StackSym*>,GlobOptBlockData::MergeBlockData(BasicBlock*,BasicBlock*,BVSparse<Memory::JitArenaAllocator>*,BVSparse<Memory::JitArenaAllocator>*,bool)::__1>
          (GlobOptBlockData *this,
          SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *toList,SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *fromList,anon_class_16_2_b01b82c3 itemsAreEqual)

{
  code *pcVar1;
  Sym *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  NodeBase *pNVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type_conflict pSVar6;
  StackSym *pSVar7;
  Type *copyPropSymTo;
  Type *pTVar8;
  StackSym *pSVar9;
  NodeBase **local_188;
  bool local_111;
  Sym *symRemain;
  Iterator iterRemain;
  bool hasRemain;
  Sym *symTo;
  Sym *symFrom;
  undefined1 auStack_c0 [6];
  bool hasFrom;
  bool hasTo;
  Iterator iterFrom;
  Iterator iterTo;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *fromList_local;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *toList_local;
  GlobOptBlockData *this_local;
  anon_class_16_2_b01b82c3 itemsAreEqual_local;
  bool local_69;
  bool local_49;
  bool local_29;
  bool local_19;
  bool local_9;
  
  itemsAreEqual_local.fromData = (GlobOptBlockData **)itemsAreEqual.this;
  this_local = (GlobOptBlockData *)itemsAreEqual.fromData;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
  Iterator::Iterator((Iterator *)&iterFrom.current,toList);
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
  Iterator::Iterator((Iterator *)auStack_c0,fromList);
  if (iterTo.list ==
      (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pNVar3 = iterFrom.current;
  pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  local_9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)pNVar3,pSVar6);
  if (local_9) {
    iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0;
  }
  else {
    iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   *)SListNodeBase<Memory::ArenaAllocator>::Next
                               (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  }
  local_9 = !local_9;
  if (fromList ==
      (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *)
      0x0) {
    local_111 = false;
  }
  else {
    if (iterFrom.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pBVar2 = _auStack_c0;
    pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)pBVar2,pSVar6);
    if (local_19) {
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_19 = !local_19;
    local_111 = local_19;
  }
  while( true ) {
    bVar4 = false;
    if (local_111) {
      bVar4 = local_9;
    }
    if (!bVar4) break;
    pTVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)auStack_c0);
    pSVar9 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar8);
    pTVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&iterFrom.current);
    pSVar7 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar8);
    if ((pSVar9->super_Sym).m_id < (pSVar7->super_Sym).m_id) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar9->super_Sym).m_id);
      if (iterFrom.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pBVar2 = _auStack_c0;
      pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      local_29 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                           *)pBVar2,pSVar6);
      if (local_29) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
      }
      else {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_29 = !local_29;
      local_111 = local_29;
    }
    else {
      if ((pSVar7->super_Sym).m_id < (pSVar9->super_Sym).m_id) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar7->super_Sym).m_id);
        if (iterTo.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pNVar3 = iterFrom.current;
        pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar6);
        if (local_9) {
          iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)0x0;
        }
        else {
          iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)SListNodeBase<Memory::ArenaAllocator>::Next
                                     (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      else {
        pTVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data((Iterator *)auStack_c0);
        copyPropSymTo =
             SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&iterFrom.current);
        bVar4 = MergeBlockData::anon_class_16_2_b01b82c3::operator()
                          ((anon_class_16_2_b01b82c3 *)&this_local,pTVar8,copyPropSymTo);
        if (!bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar7->super_Sym).m_id);
        }
        if (iterFrom.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pBVar2 = _auStack_c0;
        pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_49 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                             *)pBVar2,pSVar6);
        if (local_49) {
          iterFrom.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        else {
          iterFrom.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_49 = !local_49;
        if (iterTo.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pNVar3 = iterFrom.current;
        pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar6);
        local_111 = local_49;
        if (local_9) {
          iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)0x0;
        }
        else {
          iterTo.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)SListNodeBase<Memory::ArenaAllocator>::Next
                                     (&(iterTo.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      local_9 = !local_9;
    }
  }
  iterRemain.current._7_1_ = true;
  if (!local_111) {
    iterRemain.current._7_1_ = local_9;
  }
  if ((bool)iterRemain.current._7_1_ != false) {
    if (local_111) {
      local_188 = (NodeBase **)auStack_c0;
    }
    else {
      local_188 = &iterFrom.current;
    }
    symRemain = (Sym *)*local_188;
    iterRemain.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)local_188[1];
    do {
      pTVar8 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)&symRemain);
      pSVar9 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar8);
      BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar9->super_Sym).m_id);
      itemsAreEqual_local.this = (GlobOptBlockData *)&symRemain;
      if (iterRemain.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = symRemain;
      pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iterRemain.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      local_69 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                           *)this_00,pSVar6);
      if (local_69) {
        iterRemain.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
      }
      else {
        iterRemain.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iterRemain.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_69 = !local_69;
      iterRemain.current._7_1_ = local_69;
    } while (local_69);
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeCapturedValues(
    SListBase<CapturedList> * toList,
    SListBase<CapturedList> * fromList,
    CapturedItemsAreEqual itemsAreEqual)
{
    typename SListBase<CapturedList>::Iterator iterTo(toList);
    typename SListBase<CapturedList>::Iterator iterFrom(fromList);
    bool hasTo = iterTo.Next();
    bool hasFrom = fromList == nullptr ? false : iterFrom.Next();

    // to be conservative, only copy the captured value for common sym Ids
    // in from and to CapturedList, mark all non-common sym Ids for re-capture
    while (hasFrom && hasTo)
    {
        Sym * symFrom = iterFrom.Data().Key();
        Sym * symTo = iterTo.Data().Key();

        if (symFrom->m_id < symTo->m_id)
        {
            this->changedSyms->Set(symFrom->m_id);
            hasFrom = iterFrom.Next();
        }
        else if(symFrom->m_id > symTo->m_id)
        {
            this->changedSyms->Set(symTo->m_id);
            hasTo = iterTo.Next();
        }
        else
        {
            if (!itemsAreEqual(&iterFrom.Data(), &iterTo.Data()))
            {
                this->changedSyms->Set(symTo->m_id);
            }

            hasFrom = iterFrom.Next();
            hasTo = iterTo.Next();
        }
    }
    bool hasRemain = hasFrom || hasTo;
    if (hasRemain)
    {
        typename SListBase<CapturedList>::Iterator iterRemain(hasFrom ? iterFrom : iterTo);
        do
        {
            Sym * symRemain = iterRemain.Data().Key();
            this->changedSyms->Set(symRemain->m_id);
            hasRemain = iterRemain.Next();
        } while (hasRemain);
    }
}